

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::~TcpConnection(TcpConnection *this)

{
  self *psVar1;
  LogStream *pLVar2;
  char *str;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  
  if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_28,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    Logger::Logger(&local_ff8,file,0x3a,DEBUG,"~TcpConnection");
    psVar1 = LogStream::operator<<(&local_ff8.m_impl.m_stream,"TcpConnection::dtor[");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    psVar1 = LogStream::operator<<(psVar1,"] at ");
    pLVar2 = LogStream::operator<<(psVar1,this);
    psVar1 = LogStream::operator<<(pLVar2," fd=");
    pLVar2 = LogStream::operator<<
                       (psVar1,((this->m_channel)._M_t.
                                super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                                .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->
                               m_fd);
    psVar1 = LogStream::operator<<(pLVar2," state=");
    str = stateToString(this);
    LogStream::operator<<(psVar1,str);
    Logger::~Logger(&local_ff8);
  }
  if (this->m_state == kDisconnected) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&(this->m_outputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&(this->m_inputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>);
    std::_Function_base::~_Function_base(&(this->m_closeCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_highWaterMarkCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_writeCompleteCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_messageCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_connectionCallback).super__Function_base);
    std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
              (&this->m_channel);
    std::unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>::~unique_ptr
              (&this->m_socket);
    std::__cxx11::string::~string((string *)&this->m_name);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&(this->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
                super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    return;
  }
  __assert_fail("m_state == kDisconnected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x3d,"sznet::net::TcpConnection::~TcpConnection()");
}

Assistant:

TcpConnection::~TcpConnection()
{
	LOG_DEBUG << "TcpConnection::dtor[" << m_name << "] at " << this
		<< " fd=" << m_channel->fd()
		<< " state=" << stateToString();
	assert(m_state == kDisconnected);
}